

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::_notify<false>(NonblockingNotifierV2 *this)

{
  ulong uVar1;
  ulong uVar2;
  Waiter *pWVar3;
  reference pvVar4;
  ulong *in_RDI;
  Waiter *w_1;
  uint64_t next;
  Waiter *w;
  uint64_t newstate;
  uint64_t signals;
  uint64_t waiters;
  uint64_t state;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  undefined8 in_stack_fffffffffffffdb0;
  Waiter *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  Waiter *local_d0;
  Waiter *local_b8 [2];
  undefined4 local_a4;
  ulong local_a0;
  memory_order local_98;
  int local_94;
  reference local_90;
  Waiter *local_88;
  memory_order local_80;
  int local_7c;
  undefined4 local_6c;
  Waiter *local_68;
  Waiter **local_60;
  __int_type_conflict1 local_50;
  memory_order local_48;
  int local_44;
  __int_type_conflict1 local_40;
  reference local_38;
  bool local_29;
  Waiter *local_28;
  memory_order local_20;
  undefined4 local_1c;
  Waiter *local_18;
  Waiter **local_10;
  
  local_a4 = 5;
  local_7c = 2;
  local_80 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_7c - 1U < 2) {
    local_88 = (Waiter *)*in_RDI;
  }
  else if (local_7c == 5) {
    local_88 = (Waiter *)*in_RDI;
  }
  else {
    local_88 = (Waiter *)*in_RDI;
  }
  local_b8[0] = local_88;
  do {
    uVar1 = ((ulong)local_b8[0] & 0xfffc000) >> 0xe;
    uVar2 = ((ulong)local_b8[0] & 0x3fff0000000) >> 0x1c;
    if ((((ulong)local_b8[0] & 0x3fff) == 0x3fff) && (uVar1 == uVar2)) {
      return;
    }
    if (uVar2 < uVar1) {
      local_d0 = local_b8[0] + 0x200000;
    }
    else {
      pvVar4 = std::
               vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
               ::operator[]((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                             *)(in_RDI + 1),(ulong)((uint)local_b8[0] & 0x3fff));
      local_94 = 0;
      local_90 = pvVar4;
      local_98 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_94 - 1U < 2) {
        local_a0 = (pvVar4->next).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_94 == 5) {
        local_a0 = (pvVar4->next).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_a0 = (pvVar4->next).super___atomic_base<unsigned_long>._M_i;
      }
      local_d0 = (Waiter *)((ulong)local_b8[0] & 0x3ffffffc000 | local_a0);
    }
    local_68 = local_d0;
    local_6c = 4;
    local_60 = local_b8;
    local_20 = std::__cmpexch_failure_order
                         ((memory_order)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    local_18 = local_d0;
    local_1c = 4;
    local_28 = local_d0;
    switch(0x15bb35) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        in_stack_fffffffffffffdff = local_b8[0] == pWVar3;
        if ((bool)in_stack_fffffffffffffdff) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffdff;
        if (!(bool)in_stack_fffffffffffffdff) {
          local_b8[0] = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        in_stack_fffffffffffffdf0 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == in_stack_fffffffffffffdf0;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          in_stack_fffffffffffffdf0 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = in_stack_fffffffffffffdf0;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
      else {
        LOCK();
        pWVar3 = (Waiter *)*in_RDI;
        local_29 = local_b8[0] == pWVar3;
        if (local_29) {
          *in_RDI = (ulong)local_d0;
          pWVar3 = local_b8[0];
        }
        UNLOCK();
        if (!local_29) {
          local_b8[0] = pWVar3;
        }
      }
    }
    local_10 = local_b8;
  } while (local_29 == false);
  if ((uVar1 <= uVar2) && (((ulong)local_b8[0] & 0x3fff) != 0x3fff)) {
    pvVar4 = std::
             vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
             ::operator[]((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                           *)(in_RDI + 1),(ulong)((uint)local_b8[0] & 0x3fff));
    local_40 = 0x3fff;
    local_44 = 0;
    local_38 = pvVar4;
    local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_50 = local_40;
    if (local_44 == 3) {
      (pvVar4->next).super___atomic_base<unsigned_long>._M_i = local_40;
    }
    else if (local_44 == 5) {
      LOCK();
      (pvVar4->next).super___atomic_base<unsigned_long>._M_i = local_40;
      UNLOCK();
    }
    else {
      (pvVar4->next).super___atomic_base<unsigned_long>._M_i = local_40;
    }
    _unpark((NonblockingNotifierV2 *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
            in_stack_fffffffffffffdf0);
  }
  return;
}

Assistant:

void _notify() {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      //_check_state(state);
      const uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      const uint64_t signals = (state & kSignalMask) >> kSignalShift;
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && waiters == signals) return;
      uint64_t newstate;
      if (notifyAll) {
        // Empty wait stack and set signal to number of pre-wait threads.
        newstate = (state & kWaiterMask) | (waiters << kSignalShift) | kStackMask;
      } else if (signals < waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kSignalInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        uint64_t next = w->next.load(std::memory_order_relaxed);
        newstate = (state & (kWaiterMask | kSignalMask)) | next;
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if (!notifyAll && (signals < waiters)) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!notifyAll) w->next.store(kStackMask, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }